

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

MidiEvent * __thiscall smf::MidiFile::addEvent(MidiFile *this,int aTrack,MidiEvent *mfevent)

{
  int iVar1;
  reference ppMVar2;
  MidiEvent *pMVar3;
  MidiEvent *mfevent_local;
  int aTrack_local;
  MidiFile *this_local;
  
  iVar1 = getTrackState(this);
  if (iVar1 == 1) {
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,0);
    MidiEventList::push_back(*ppMVar2,mfevent);
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,0);
    pMVar3 = MidiEventList::back(*ppMVar2);
    pMVar3->track = aTrack;
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::operator[]
                        (&this->m_events,0);
    this_local = (MidiFile *)MidiEventList::back(*ppMVar2);
  }
  else {
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::at
                        (&this->m_events,(long)aTrack);
    MidiEventList::push_back(*ppMVar2,mfevent);
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::at
                        (&this->m_events,(long)aTrack);
    pMVar3 = MidiEventList::back(*ppMVar2);
    pMVar3->track = aTrack;
    ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::at
                        (&this->m_events,(long)aTrack);
    this_local = (MidiFile *)MidiEventList::back(*ppMVar2);
  }
  return (MidiEvent *)this_local;
}

Assistant:

MidiEvent* MidiFile::addEvent(int aTrack, MidiEvent& mfevent) {
	if (getTrackState() == TRACK_STATE_JOINED) {
		m_events[0]->push_back(mfevent);
      m_events[0]->back().track = aTrack;
		return &m_events[0]->back();
	} else {
		m_events.at(aTrack)->push_back(mfevent);
		m_events.at(aTrack)->back().track = aTrack;
		return &m_events.at(aTrack)->back();
	}
}